

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

int __thiscall MIDIStreamer::FillStopBuffer(MIDIStreamer *this,int buffer_num)

{
  DWORD DVar1;
  int iVar2;
  DWORD *pDVar3;
  DWORD (*events) [384];
  
  events = this->Events + buffer_num;
  pDVar3 = WriteStopNotes(this,*events);
  pDVar3[0] = 500;
  pDVar3[1] = 0;
  pDVar3[2] = 0x2000000;
  this->Buffer[buffer_num].lpNext = (MIDIHDR *)0x0;
  this->Buffer[buffer_num].lpData = (BYTE *)events;
  DVar1 = ((int)pDVar3 - (int)events) + 0xc;
  this->Buffer[buffer_num].dwBufferLength = DVar1;
  this->Buffer[buffer_num].dwBytesRecorded = DVar1;
  iVar2 = (*this->MIDI->_vptr_MIDIDevice[0xc])();
  if (iVar2 != 0) {
    iVar2 = iVar2 * 4 + 2;
  }
  return iVar2;
}

Assistant:

int MIDIStreamer::FillStopBuffer(int buffer_num)
{
	DWORD *events = Events[buffer_num];
	int i;

	events = WriteStopNotes(events);

	// wait some tics, just so that this buffer takes some time
	events[0] = 500;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;
	events += 3;

	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}